

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O1

bool TestCompressionF<Counter<unsigned_long,64u>,Counter<unsigned_char,4u>>(int bias)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  uint recent;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  bool bVar13;
  ulong uVar12;
  
  lVar7 = 0;
  bVar5 = 0;
  uVar10 = 0;
  bVar13 = false;
  do {
    bVar6 = (bVar5 & 0xf) * '\x02';
    uVar11 = (uint)uVar10 & 0xf;
    uVar12 = (ulong)uVar11;
    uVar9 = 0;
    uVar8 = uVar10;
    do {
      if (uVar9 < uVar10) {
        iVar3 = 7;
        if ((long)uVar8 < (long)(8 - bias)) {
LAB_00102b1c:
          uVar4 = (ulong)((uint)uVar9 & 0x10 | uVar11);
          uVar1 = (ulong)((uint)uVar9 & 0xf);
          if (uVar1 < uVar12) {
            uVar2 = uVar4 - 0x10;
            if (uVar12 - uVar1 < 8U - (long)bias) {
              uVar2 = uVar4;
            }
          }
          else {
            uVar2 = uVar4 + 0x10;
            if (uVar1 - uVar12 <= (long)bias + 8U) {
              uVar2 = uVar4;
            }
          }
          iVar3 = 1;
          if ((uVar2 == uVar10) &&
             ((bias != 0 ||
              ((((bVar6 >> 4 & 1) << 4) + uVar10) - (ulong)((uint)uVar8 & 0xf) == uVar9)))) {
            iVar3 = 0;
          }
        }
      }
      else {
        if ((long)(lVar7 + uVar9) <= (long)(bias + 8)) goto LAB_00102b1c;
        iVar3 = 7;
      }
      if ((iVar3 != 7) && (iVar3 != 0)) goto LAB_00102ba7;
      uVar9 = uVar9 + 1;
      bVar6 = bVar6 - 2;
      uVar8 = uVar8 - 1;
    } while (uVar9 != 0x20);
    iVar3 = 5;
LAB_00102ba7:
    if ((iVar3 != 5) && (iVar3 != 0)) {
      return bVar13;
    }
    bVar13 = 0x1e < uVar10;
    uVar10 = uVar10 + 1;
    bVar5 = bVar5 + 1;
    lVar7 = lVar7 + -1;
    if (uVar10 == 0x20) {
      return bVar13;
    }
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}